

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIComboBox.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIComboBox::setSelected(CGUIComboBox *this,s32 idx)

{
  pointer pSVar1;
  IGUIStaticText *pIVar2;
  long lVar3;
  
  if (-2 < idx) {
    pSVar1 = (this->Items).m_data.
             super__Vector_base<irr::gui::CGUIComboBox::SComboData,_std::allocator<irr::gui::CGUIComboBox::SComboData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(this->Items).m_data.
                  super__Vector_base<irr::gui::CGUIComboBox::SComboData,_std::allocator<irr::gui::CGUIComboBox::SComboData>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1;
    if (idx < (int)(lVar3 / 0x28)) {
      this->Selected = idx;
      pIVar2 = this->SelectedText;
      if (idx != -1) {
        (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x14])
                  (pIVar2,pSVar1[(uint)idx].Name.str._M_dataplus);
        return;
      }
      (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x14])
                (pIVar2,L"",lVar3 % 0x28);
      return;
    }
  }
  return;
}

Assistant:

void CGUIComboBox::setSelected(s32 idx)
{
	if (idx < -1 || idx >= (s32)Items.size())
		return;

	Selected = idx;
	if (Selected == -1)
		SelectedText->setText(L"");
	else
		SelectedText->setText(Items[Selected].Name.c_str());
}